

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashMap.h
# Opt level: O3

void __thiscall HashMap<TypeClass_*>::insert(HashMap<TypeClass_*> *this,uint hash,TypeClass *value)

{
  Allocator *pAVar1;
  Node **ppNVar2;
  int iVar3;
  undefined4 extraout_var;
  Node *pNVar4;
  uint uVar5;
  
  uVar5 = (this->freeList).count;
  if (uVar5 == 0) {
    pAVar1 = this->allocator;
    if (pAVar1 == (Allocator *)0x0) {
      pNVar4 = (Node *)ChunkedStackPool<4092>::Allocate(&this->nodePool,0x18);
    }
    else {
      iVar3 = (*pAVar1->_vptr_Allocator[2])(pAVar1,0x18);
      pNVar4 = (Node *)CONCAT44(extraout_var,iVar3);
    }
  }
  else {
    uVar5 = uVar5 - 1;
    pNVar4 = (this->freeList).data[uVar5];
    (this->freeList).count = uVar5;
  }
  pNVar4->value = value;
  pNVar4->hash = hash;
  ppNVar2 = this->entries;
  pNVar4->next = ppNVar2[hash & 0x3ff];
  ppNVar2[hash & 0x3ff] = pNVar4;
  return;
}

Assistant:

void insert(unsigned int hash, Value value)
	{
		unsigned int bucket = hash & bucketMask;

		Node *n = NULL;

		if(!freeList.empty())
		{
			n = freeList.back();
			freeList.pop_back();
		}
		else
		{
			if(allocator)
				n = (Node*)allocator->alloc(sizeof(Node));
			else
				n = (Node*)nodePool.Allocate(sizeof(Node));
		}

		n->value = value;
		n->hash = hash;
		n->next = entries[bucket];
		entries[bucket] = n;
	}